

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O3

void CB_ADF::output_rank_example(vw *all,cb_adf *c,example *ec,multi_ex *ec_seq)

{
  v_array<char> *pvVar1;
  polyprediction *a_s;
  int iVar2;
  wclass *pwVar3;
  wclass *pwVar4;
  int *piVar5;
  _func_void_int_string_v_array<char> *p_Var6;
  v_array<char> vVar7;
  byte bVar8;
  bool bVar9;
  ostream *poVar10;
  float *pfVar11;
  int *piVar12;
  long lVar13;
  long lVar14;
  string outputString;
  stringstream outputStringStream;
  undefined6 in_stack_fffffffffffffde8;
  char in_stack_fffffffffffffdee;
  vw *pvVar15;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pwVar3 = (ec->l).cs.costs._begin;
  pwVar4 = (ec->l).cs.costs._end;
  if ((((ec->tag)._end != (ec->tag)._begin) ||
      ((ec->super_example_predict).indices._end != (ec->super_example_predict).indices._begin)) ||
     (bVar9 = CB::ec_is_example_header(ec), bVar9)) {
    pvVar1 = &ec->tag;
    bVar8 = update_statistics(all,c,ec,ec_seq);
    piVar12 = (all->final_prediction_sink)._begin;
    piVar5 = (all->final_prediction_sink)._end;
    if (piVar12 != piVar5) {
      a_s = &ec->pred;
      do {
        ACTION_SCORE::print_action_score
                  (*piVar12,(v_array<ACTION_SCORE::action_score> *)&a_s->scalars,pvVar1);
        piVar12 = piVar12 + 1;
      } while (piVar12 != piVar5);
    }
    if (0 < all->raw_prediction) {
      local_1f8 = local_1e8;
      local_1f0 = 0;
      local_1e8[0] = 0;
      std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_1f8,_S_out|_S_in);
      lVar14 = (long)pwVar4 - (long)pwVar3;
      if (lVar14 != 0) {
        lVar14 = lVar14 >> 4;
        pfVar11 = &pwVar3->wap_value;
        lVar13 = 0;
        do {
          if (lVar13 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,&stack0xfffffffffffffdee,1);
          }
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          in_stack_fffffffffffffdee = ':';
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,&stack0xfffffffffffffdee,1);
          std::ostream::_M_insert<double>((double)*pfVar11);
          lVar13 = lVar13 + 1;
          pfVar11 = pfVar11 + 4;
        } while (lVar14 + (ulong)(lVar14 == 0) != lVar13);
      }
      p_Var6 = all->print_text;
      iVar2 = all->raw_prediction;
      pvVar15 = all;
      std::__cxx11::stringbuf::str();
      vVar7._begin._6_1_ = in_stack_fffffffffffffdee;
      vVar7._begin._0_6_ = in_stack_fffffffffffffde8;
      vVar7._begin._7_1_ = bVar8;
      vVar7._end = (char *)ec;
      vVar7.end_array = (char *)pvVar15;
      vVar7.erase_count = (size_t)ec_seq;
      (*p_Var6)(iVar2,(string)*pvVar1,vVar7);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8);
      }
    }
    CB::print_update(all,(bool)(bVar8 ^ 1),ec,ec_seq,true);
  }
  return;
}

Assistant:

void output_rank_example(vw& all, cb_adf& c, example& ec, multi_ex* ec_seq)
{
  label& ld = ec.l.cb;
  v_array<CB::cb_class> costs = ld.costs;

  if (example_is_newline_not_header(ec))
    return;

  bool labeled_example = update_statistics(all, c, ec, ec_seq);

  for (int sink : all.final_prediction_sink) print_action_score(sink, ec.pred.a_s, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].action << ':' << costs[i].partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  CB::print_update(all, !labeled_example, ec, ec_seq, true);
}